

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O2

int coda_expression_eval_string(coda_expression *expr,coda_cursor *cursor,char **value,long *length)

{
  char *__ptr;
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  long offset;
  eval_info info;
  
  if (expr->result_type == coda_expression_string) {
    if (cursor == (coda_cursor *)0x0) {
      if (expr->is_constant == 0) {
        pcVar3 = "cursor argument may not be NULL if expression is not constant";
        goto LAB_00139657;
      }
      info.orig_cursor = (coda_cursor *)0x0;
    }
    else {
      info.orig_cursor = cursor;
      memcpy(&info.cursor,cursor,0x310);
    }
    info.index[2] = 0;
    info.variable_index = 0;
    info.index[0] = 0;
    info.index[1] = 0;
    info.variable_name = (char *)0x0;
    iVar1 = eval_string(&info,expr,&offset,length,value);
    if (iVar1 == 0) {
      __n = *length;
      if ((long)__n < 1) {
        free(*value);
        *value = (char *)0x0;
      }
      else {
        if (offset == 0) {
          pcVar3 = *value;
        }
        else {
          pcVar3 = (char *)malloc(__n + 1);
          if (pcVar3 == (char *)0x0) {
            coda_set_error(-1,"out of memory (could not allocate %ld bytes) (%s:%u)",__n,
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-expr.c"
                           ,0x14cb);
            return -1;
          }
          __ptr = *value;
          memcpy(pcVar3,__ptr + offset,__n);
          free(__ptr);
          *value = pcVar3;
          __n = *length;
        }
        pcVar3[__n] = '\0';
      }
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
      if (cursor != (coda_cursor *)0x0) {
        iVar2 = coda_cursor_compare(cursor,&info.cursor);
        if (iVar2 != 0) {
          coda_cursor_add_to_error_message(&info.cursor);
        }
      }
    }
  }
  else {
    pcVar3 = "expression is not a \'string\' expression";
LAB_00139657:
    coda_set_error(-100,pcVar3);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

LIBCODA_API int coda_expression_eval_string(const coda_expression *expr, const coda_cursor *cursor, char **value,
                                            long *length)
{
    eval_info info;
    long offset;

    if (expr->result_type != coda_expression_string)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not a 'string' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_string(&info, expr, &offset, length, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    if (*length > 0)
    {
        if (offset != 0)
        {
            char *truncated_value;

            truncated_value = malloc(*length + 1);
            if (truncated_value == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %ld bytes) (%s:%u)",
                               *length, __FILE__, __LINE__);
                return -1;
            }
            memcpy(truncated_value, &(*value)[offset], *length);
            free(*value);
            *value = truncated_value;
        }
        (*value)[*length] = '\0';
    }
    else
    {
        if (*value != NULL)
        {
            free(*value);
        }
        *value = NULL;
    }

    return 0;
}